

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:357:5)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:357:5)>
      *this)

{
  PromiseNode *pPVar1;
  CapTableBuilder *pCVar2;
  WirePointer *pWVar3;
  undefined8 uVar4;
  Disposer *pDVar5;
  size_t in_RCX;
  void *in_RDX;
  int in_R8D;
  PropagateException local_1c9;
  Own<kj::_::PromiseNode> local_1c8;
  Request<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsParams,_capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>
  local_1b0;
  ExceptionOrValue local_178;
  char local_18;
  
  capnp::
  Request<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsParams,_capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>
  ::send(&local_1b0,(int)(this->func).req,in_RDX,in_RCX,in_R8D);
  heap<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>,kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>>::ignoreResult()::_lambda(capnp::Response<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>>::ignoreResult()::_lambda(capnp::Response<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>&&)_1_,kj::_::PropagateException>
            ((Own<kj::_::PromiseNode> *)&local_178,(anon_class_1_0_00000001_for_func *)&local_1b0,
             &local_1c9);
  local_1c8.disposer =
       (Disposer *)CONCAT71(local_178.exception.ptr._1_7_,local_178.exception.ptr.isSet);
  local_1c8.ptr = (PromiseNode *)local_178.exception.ptr.field_1.value.ownFile.content.ptr;
  local_178.exception.ptr.isSet = false;
  local_18 = '\0';
  waitImpl(&local_1c8,&local_178,((this->func).ioContext)->waitScope);
  if (local_18 == '\x01') {
    if (local_178.exception.ptr.isSet != false) {
      throwRecoverableException(&local_178.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_178.exception.ptr.isSet == false) {
      unreachable();
    }
    throwRecoverableException(&local_178.exception.ptr.field_1.value,0);
  }
  if (local_178.exception.ptr.isSet == true) {
    Exception::~Exception(&local_178.exception.ptr.field_1.value);
  }
  pPVar1 = local_1c8.ptr;
  if (local_1c8.ptr != (PromiseNode *)0x0) {
    local_1c8.ptr = (PromiseNode *)0x0;
    (**(local_1c8.disposer)->_vptr_Disposer)
              (local_1c8.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  pDVar5 = local_1b0.hook.disposer;
  uVar4 = local_1b0.super_Builder._builder._32_8_;
  if (local_1b0.super_Builder._builder._32_8_ != 0) {
    local_1b0.super_Builder._builder.dataSize = 0;
    local_1b0.super_Builder._builder.pointerCount = 0;
    local_1b0.super_Builder._builder._38_2_ = 0;
    local_1b0.hook.disposer = (Disposer *)0x0;
    (**(local_1b0.hook.ptr)->_vptr_RequestHook)(local_1b0.hook.ptr,uVar4,8,pDVar5,pDVar5,0);
  }
  pWVar3 = local_1b0.super_Builder._builder.pointers;
  if (local_1b0.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_1b0.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_1b0.super_Builder._builder.data)
              (local_1b0.super_Builder._builder.data,
               (long)&(pWVar3->offsetAndKind).value + *(long *)((long)*pWVar3 + -0x10));
  }
  pCVar2 = local_1b0.super_Builder._builder.capTable;
  if (local_1b0.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_1b0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_1b0.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_1b0.super_Builder._builder.segment,
      (pCVar2->super_CapTableReader)._vptr_CapTableReader[-2] +
      (long)&(pCVar2->super_CapTableReader)._vptr_CapTableReader);
  }
  return;
}

Assistant:

void run() override {
    func();
  }